

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O3

void * ZIP_openArchive(PHYSFS_Io *io,char *name,int forWriting,int *claimed)

{
  PHYSFS_Io *io_00;
  PHYSFS_uint64 offset;
  int iVar1;
  int iVar2;
  PHYSFS_sint64 PVar3;
  ZIPinfo *info_00;
  ulong uVar4;
  ulong uVar5;
  ZIPentry *pZVar6;
  ZIPinfo *info;
  ulong uVar7;
  PHYSFS_ErrorCode errcode;
  PHYSFS_uint64 ofs_fixup;
  PHYSFS_uint16 ui16;
  PHYSFS_uint32 ui32_1;
  PHYSFS_uint32 sig;
  PHYSFS_uint32 ui32;
  PHYSFS_uint16 entryCount16;
  PHYSFS_uint32 offset32;
  ushort local_66;
  PHYSFS_uint32 local_64;
  undefined8 local_60;
  uint local_54;
  ushort local_50;
  PHYSFS_uint16 local_4e;
  uint local_4c;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  if (io == (PHYSFS_Io *)0x0) {
    __assert_fail("io != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/icculus[P]physfs/src/physfs_archiver_zip.c"
                  ,0x5c6,"void *ZIP_openArchive(PHYSFS_Io *, const char *, int, int *)");
  }
  if (forWriting != 0) {
    errcode = PHYSFS_ERR_READ_ONLY;
LAB_0011542c:
    PHYSFS_setErrorCode(errcode);
    return (void *)0x0;
  }
  local_60._0_4_ = 0;
  iVar1 = readui32(io,(PHYSFS_uint32 *)&local_60);
  if (iVar1 == 0) {
    return (void *)0x0;
  }
  if (((PHYSFS_uint32)local_60 != 0x4034b50) &&
     (PVar3 = zip_find_end_of_central_dir(io,(PHYSFS_sint64 *)0x0), PVar3 == -1)) {
    return (void *)0x0;
  }
  *claimed = 1;
  info_00 = (ZIPinfo *)(*__PHYSFS_AllocatorHooks.Malloc)(0x38);
  if (info_00 == (ZIPinfo *)0x0) {
    errcode = PHYSFS_ERR_OUT_OF_MEMORY;
    goto LAB_0011542c;
  }
  (info_00->tree).case_sensitive = 0;
  (info_00->tree).only_usascii = 0;
  info_00->io = (PHYSFS_Io *)0x0;
  (info_00->tree).hashBuckets = 0;
  (info_00->tree).entrylen = 0;
  (info_00->tree).root = (__PHYSFS_DirTreeEntry *)0x0;
  (info_00->tree).hash = (__PHYSFS_DirTreeEntry **)0x0;
  info_00->zip64 = 0;
  info_00->has_crypto = 0;
  info_00->io = io;
  uVar4 = zip_find_end_of_central_dir(io,&local_38);
  if (((uVar4 == 0xffffffffffffffff) || (iVar1 = (*io->seek)(io,uVar4), iVar1 == 0)) ||
     (iVar1 = readui32(io,&local_54), iVar1 == 0)) goto LAB_0011571d;
  if (local_54 == 0x6054b50) {
    if ((long)uVar4 < 0x14) goto LAB_0011571d;
    io_00 = info_00->io;
    iVar1 = (*io_00->seek)(io_00,uVar4 - 0x14);
    if ((iVar1 == 0) || (iVar1 = readui32(io_00,&local_64), iVar1 == 0)) goto LAB_0011571d;
    if (local_64 == 0x7064b50) {
      info_00->zip64 = 1;
      iVar1 = readui32(io_00,&local_64);
      if (iVar1 == 0) goto LAB_0011571d;
      if (local_64 == 0) {
        iVar1 = readui64(io_00,&local_60);
        if ((iVar1 == 0) || (iVar1 = readui32(io_00,&local_64), iVar1 == 0)) goto LAB_0011571d;
        if (local_64 == 1) {
          offset = CONCAT44(local_60._4_4_,(PHYSFS_uint32)local_60);
          uVar4 = zip64_find_end_of_central_dir(io_00,uVar4 - 0x14,offset);
          if ((long)uVar4 < 0) goto LAB_0011571d;
          ofs_fixup = uVar4 - offset;
          if (uVar4 < offset) {
            __assert_fail("((PHYSFS_uint64) pos) >= ui64",
                          "/workspace/llm4binary/github/license_c_cmakelists/icculus[P]physfs/src/physfs_archiver_zip.c"
                          ,0x521,
                          "int zip64_parse_end_of_central_dir(ZIPinfo *, PHYSFS_uint64 *, PHYSFS_uint64 *, PHYSFS_uint64 *, PHYSFS_sint64)"
                         );
          }
          iVar1 = (*io_00->seek)(io_00,uVar4);
          if ((iVar1 == 0) || (iVar1 = readui32(io_00,&local_64), iVar1 == 0)) goto LAB_0011571d;
          if (local_64 == 0x6064b50) {
            iVar1 = readui64(io_00,&local_60);
            if ((((iVar1 == 0) || (iVar1 = readui16(io_00,&local_4e), iVar1 == 0)) ||
                (iVar1 = readui16(io_00,&local_4e), iVar1 == 0)) ||
               (iVar1 = readui32(io_00,&local_64), iVar1 == 0)) goto LAB_0011571d;
            if (local_64 == 0) {
              iVar1 = readui32(io_00,&local_64);
              if (iVar1 == 0) goto LAB_0011571d;
              if (local_64 == 0) {
                iVar1 = readui64(io_00,&local_60);
                if ((iVar1 == 0) || (iVar1 = readui64(io_00,&local_48), iVar1 == 0))
                goto LAB_0011571d;
                uVar7 = CONCAT44(local_60._4_4_,(PHYSFS_uint32)local_60);
                if (uVar7 == local_48) {
                  iVar1 = readui64(io_00,&local_60);
                  if ((iVar1 == 0) || (iVar1 = readui64(io_00,&local_40), iVar1 == 0))
                  goto LAB_0011571d;
                  goto LAB_001157ec;
                }
              }
            }
          }
        }
      }
    }
    else {
      iVar1 = (*io->seek)(io,uVar4 + 4);
      if ((iVar1 == 0) || (iVar1 = readui16(io,&local_66), iVar1 == 0)) goto LAB_0011571d;
      if (local_66 == 0) {
        iVar1 = readui16(io,&local_66);
        if (iVar1 == 0) goto LAB_0011571d;
        if (local_66 == 0) {
          iVar1 = readui16(io,&local_66);
          if ((iVar1 == 0) || (iVar1 = readui16(io,&local_50), iVar1 == 0)) goto LAB_0011571d;
          uVar7 = (ulong)local_66;
          if (local_66 == local_50) {
            iVar1 = readui32(io,&local_54);
            if ((iVar1 == 0) || (iVar1 = readui32(io,&local_4c), iVar1 == 0)) goto LAB_0011571d;
            uVar5 = (ulong)local_54 + (ulong)local_4c;
            ofs_fixup = uVar4 - uVar5;
            if (uVar5 <= uVar4) {
              iVar1 = readui16(io,&local_66);
              if (iVar1 == 0) goto LAB_0011571d;
              local_40 = (ulong)local_4c;
              if (local_66 + uVar4 + 0x16 == local_38) {
LAB_001157ec:
                iVar1 = __PHYSFS_DirTreeInit((__PHYSFS_DirTree *)info_00,0x70,1,0);
                if (iVar1 != 0) {
                  *(undefined4 *)&(info_00->tree).root[1].hashnext = 4;
                  iVar1 = info_00->zip64;
                  iVar2 = (*info_00->io->seek)(info_00->io,local_40 + ofs_fixup);
                  if (iVar2 != 0) {
                    while( true ) {
                      if (uVar7 == 0) {
                        if (((info_00->tree).root)->sibling != (__PHYSFS_DirTreeEntry *)0x0) {
                          __assert_fail("info->tree.root->sibling == NULL",
                                        "/workspace/llm4binary/github/license_c_cmakelists/icculus[P]physfs/src/physfs_archiver_zip.c"
                                        ,0x5de,
                                        "void *ZIP_openArchive(PHYSFS_Io *, const char *, int, int *)"
                                       );
                        }
                        return info_00;
                      }
                      pZVar6 = zip_load_entry(info_00,iVar1,ofs_fixup);
                      if (pZVar6 == (ZIPentry *)0x0) break;
                      if ((pZVar6->general_bits & 1) != 0) {
                        info_00->has_crypto = 1;
                      }
                      uVar7 = uVar7 - 1;
                    }
                  }
                }
                goto LAB_0011571d;
              }
            }
          }
        }
      }
    }
  }
  PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
LAB_0011571d:
  info_00->io = (PHYSFS_Io *)0x0;
  __PHYSFS_DirTreeDeinit((__PHYSFS_DirTree *)info_00);
  (*__PHYSFS_AllocatorHooks.Free)(info_00);
  return (void *)0x0;
}

Assistant:

static void *ZIP_openArchive(PHYSFS_Io *io, const char *name,
                             int forWriting, int *claimed)
{
    ZIPinfo *info = NULL;
    ZIPentry *root = NULL;
    PHYSFS_uint64 dstart = 0;  /* data start */
    PHYSFS_uint64 cdir_ofs;  /* central dir offset */
    PHYSFS_uint64 count;

    assert(io != NULL);  /* shouldn't ever happen. */

    BAIL_IF(forWriting, PHYSFS_ERR_READ_ONLY, NULL);
    BAIL_IF_ERRPASS(!isZip(io), NULL);

    *claimed = 1;

    info = (ZIPinfo *) allocator.Malloc(sizeof (ZIPinfo));
    BAIL_IF(!info, PHYSFS_ERR_OUT_OF_MEMORY, NULL);
    memset(info, '\0', sizeof (ZIPinfo));

    info->io = io;

    if (!zip_parse_end_of_central_dir(info, &dstart, &cdir_ofs, &count))
        goto ZIP_openarchive_failed;
    else if (!__PHYSFS_DirTreeInit(&info->tree, sizeof (ZIPentry), 1, 0))
        goto ZIP_openarchive_failed;

    root = (ZIPentry *) info->tree.root;
    root->resolved = ZIP_DIRECTORY;

    if (!zip_load_entries(info, dstart, cdir_ofs, count))
        goto ZIP_openarchive_failed;

    assert(info->tree.root->sibling == NULL);
    return info;

ZIP_openarchive_failed:
    info->io = NULL;  /* don't let ZIP_closeArchive destroy (io). */
    ZIP_closeArchive(info);
    return NULL;
}